

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O0

bool Assimp::TokenMatch<char_const>(char **in,char *token,uint len)

{
  bool bVar1;
  int iVar2;
  uint len_local;
  char *token_local;
  char **in_local;
  
  iVar2 = strncmp(token,*in,(ulong)len);
  if ((iVar2 == 0) && (bVar1 = IsSpaceOrNewLine<char>((*in)[len]), bVar1)) {
    if ((*in)[len] == '\0') {
      *in = *in + len;
    }
    else {
      *in = *in + (len + 1);
    }
    in_local._7_1_ = true;
  }
  else {
    in_local._7_1_ = false;
  }
  return in_local._7_1_;
}

Assistant:

AI_FORCE_INLINE
bool TokenMatch(char_t*& in, const char* token, unsigned int len)
{
    if (!::strncmp(token,in,len) && IsSpaceOrNewLine(in[len])) {
        if (in[len] != '\0') {
            in += len+1;
        } else {
            // If EOF after the token make sure we don't go past end of buffer
            in += len;
        }
        return true;
    }

    return false;
}